

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.c
# Opt level: O1

TokenizerW * tok_winit(wchar_t *ifs)

{
  TokenizerW *__ptr;
  wchar_t *__ptr_00;
  wchar_t **__ptr_01;
  wchar_t *pwVar1;
  int *__s;
  
  __ptr = (TokenizerW *)malloc(0x48);
  if (__ptr != (TokenizerW *)0x0) {
    __s = anon_var_dwarf_2474c;
    if (ifs != (wchar_t *)0x0) {
      __s = ifs;
    }
    __ptr_00 = wcsdup(__s);
    __ptr->ifs = __ptr_00;
    if (__ptr_00 != (wchar_t *)0x0) {
      __ptr->argc = 0;
      __ptr->amax = 10;
      __ptr_01 = (wchar_t **)malloc(0x50);
      __ptr->argv = __ptr_01;
      if (__ptr_01 != (wchar_t **)0x0) {
        *__ptr_01 = (wchar_t *)0x0;
        pwVar1 = (wchar_t *)malloc(0x50);
        __ptr->wspace = pwVar1;
        if (pwVar1 != (wchar_t *)0x0) {
          __ptr->wmax = pwVar1 + 0x14;
          __ptr->wstart = pwVar1;
          __ptr->wptr = pwVar1;
          __ptr->quote = Q_none;
          __ptr->flags = L'\0';
          return __ptr;
        }
        free(__ptr_01);
      }
      free(__ptr_00);
    }
    free(__ptr);
  }
  return (TokenizerW *)0x0;
}

Assistant:

TYPE(Tokenizer) *
FUN(tok,init)(const Char *ifs)
{
	TYPE(Tokenizer) *tok = tok_malloc(sizeof(*tok));

	if (tok == NULL)
		return NULL;
	tok->ifs = tok_strdup(ifs ? ifs : IFS);
	if (tok->ifs == NULL) {
		tok_free(tok);
		return NULL;
	}
	tok->argc = 0;
	tok->amax = AINCR;
	tok->argv = tok_malloc(sizeof(*tok->argv) * tok->amax);
	if (tok->argv == NULL) {
		tok_free(tok->ifs);
		tok_free(tok);
		return NULL;
	}
	tok->argv[0] = NULL;
	tok->wspace = tok_malloc(WINCR * sizeof(*tok->wspace));
	if (tok->wspace == NULL) {
		tok_free(tok->argv);
		tok_free(tok->ifs);
		tok_free(tok);
		return NULL;
	}
	tok->wmax = tok->wspace + WINCR;
	tok->wstart = tok->wspace;
	tok->wptr = tok->wspace;
	tok->flags = 0;
	tok->quote = Q_none;

	return tok;
}